

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::String,kj::String>
          (String *__return_storage_ptr__,kj *this,String *params,String *params_1)

{
  long lVar1;
  char *pcVar2;
  long local_28;
  ArrayPtr<const_char> *local_20;
  ArrayPtr<const_char> local_18;
  
  lVar1 = *(long *)(this + 8);
  local_28 = lVar1;
  if (lVar1 != 0) {
    local_28 = *(long *)this;
  }
  local_20 = (ArrayPtr<const_char> *)(lVar1 + -1);
  if (lVar1 == 0) {
    local_20 = (ArrayPtr<const_char> *)0x0;
  }
  pcVar2 = (char *)(params->content).size_;
  local_18.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_18.ptr = (params->content).ptr;
  }
  local_18.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_18.size_ = (size_t)(ArrayPtr<const_char> *)0x0;
  }
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,&local_18,(ArrayPtr<const_char> *)local_18.size_)
  ;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}